

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall
BarrierTest_ArriveAndWaitCompletion_Test::~BarrierTest_ArriveAndWaitCompletion_Test
          (BarrierTest_ArriveAndWaitCompletion_Test *this)

{
  BarrierTest_ArriveAndWaitCompletion_Test *this_local;
  
  ~BarrierTest_ArriveAndWaitCompletion_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndWaitCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{1, complation};
  EXPECT_NO_THROW(barrier.arrive_and_wait());
  EXPECT_EQ(counter, 1);
  EXPECT_NO_THROW(barrier.arrive_and_wait());
  EXPECT_EQ(counter, 2);
}